

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latexOutline.cpp
# Opt level: O3

void generateOutline(vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> *outline,TSNode node,
                    File *file,bool recursive,Point endPoint)

{
  TSNode self;
  TSNode self_00;
  TSNode node_00;
  TSNode child_00;
  TSNode child_01;
  uint32_t uVar1;
  int iVar2;
  char *pcVar3;
  uint32_t child_index;
  TSNode child;
  TSNode local_50;
  
  uVar1 = ts_node_named_child_count(node);
  if (uVar1 != 0) {
    child_index = 0;
    do {
      ts_node_named_child(&local_50,node,child_index);
      self.context[2] = local_50.context[2];
      self.context[3] = local_50.context[3];
      self.context[0] = local_50.context[0];
      self.context[1] = local_50.context[1];
      self.id = local_50.id;
      self.tree = local_50.tree;
      pcVar3 = ts_node_type(self);
      iVar2 = strcmp(pcVar3,"control_word");
      if (iVar2 == 0) {
        child_00.context[2] = local_50.context[2];
        child_00.context[3] = local_50.context[3];
        child_00.context[0] = local_50.context[0];
        child_00.context[1] = local_50.context[1];
        child_00.id = local_50.id;
        child_00.tree = local_50.tree;
        addControlWordOutline(outline,child_00,file,endPoint);
      }
      else {
        self_00.context[2] = local_50.context[2];
        self_00.context[3] = local_50.context[3];
        self_00.context[0] = local_50.context[0];
        self_00.context[1] = local_50.context[1];
        self_00.id = local_50.id;
        self_00.tree = local_50.tree;
        pcVar3 = ts_node_type(self_00);
        iVar2 = strcmp(pcVar3,"environment");
        if (iVar2 == 0) {
          child_01.context[2] = local_50.context[2];
          child_01.context[3] = local_50.context[3];
          child_01.context[0] = local_50.context[0];
          child_01.context[1] = local_50.context[1];
          child_01.id = local_50.id;
          child_01.tree = local_50.tree;
          addEnvOutline(outline,child_01,file,recursive);
        }
        else if (recursive) {
          node_00.context[2] = local_50.context[2];
          node_00.context[3] = local_50.context[3];
          node_00.context[0] = local_50.context[0];
          node_00.context[1] = local_50.context[1];
          node_00.id = local_50.id;
          node_00.tree = local_50.tree;
          generateOutline(outline,node_00,file,true,endPoint);
        }
      }
      child_index = child_index + 1;
    } while (uVar1 != child_index);
  }
  return;
}

Assistant:

void generateOutline (vector<DocumentSymbol> &outline, TSNode node, File &file, bool recursive, Point endPoint) {
    uint32_t numChildren = ts_node_named_child_count(node);
    for (uint32_t i = 0; i < numChildren; i++) {
        TSNode child = ts_node_named_child(node, i);

        if (NODE_NAME_IS(child, "control_word")) {
            addControlWordOutline(outline, child, file, endPoint);
        } else if (NODE_NAME_IS(child, "environment")) {
            addEnvOutline(outline, child, file, recursive);
        } else if (recursive) {
            generateOutline(outline, child, file, recursive, endPoint);
        }
    }
}